

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O3

Gia_Man_t * Gia_ManFraigCreateGia(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t GVar6;
  int iVar7;
  uint uVar8;
  Vec_Int_t *p_00;
  int *piVar9;
  long lVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *p_01;
  size_t sVar12;
  char *pcVar13;
  Gia_Obj_t *pGVar14;
  void *pvVar15;
  Gia_Man_t *pGVar16;
  long lVar17;
  
  if (p->pManTime == (void *)0x0) {
    __assert_fail("p->pManTime != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x105,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  if (0 < p->nObjs) {
    if (p->nTravIdsAlloc < 1) {
LAB_0022d9f2:
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar11 = p->pObjs;
    *p->pTravIds = p->nTravIds;
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 1000;
    p_00->nSize = 0;
    piVar9 = (int *)malloc(4000);
    p_00->pArray = piVar9;
    lVar10 = (long)p->nObjs;
    if (lVar10 < 1) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar8 = (uint)*(undefined8 *)(pGVar11 + lVar10 + -1);
    if ((-1 < (int)uVar8) || ((uVar8 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                    ,0x10d,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
    }
    pGVar11 = pGVar11 + lVar10 + -1;
    iVar7 = 1;
    do {
      pGVar11 = Gia_ManFraigMarkCos(p,pGVar11,iVar7);
      uVar8 = (uint)*(undefined8 *)pGVar11;
      if ((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) {
        pGVar11 = Gia_ManFraigMarkAnd(p,pGVar11);
        uVar8 = (uint)*(undefined8 *)pGVar11;
      }
      if ((uVar8 & 0x9fffffff) != 0x9fffffff) {
        __assert_fail("Gia_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                      ,0x113,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
      }
      iVar7 = Gia_ManFraigCheckCis(p,pGVar11);
      pGVar11 = Gia_ManFraigMarkCis(p,pGVar11,iVar7);
      Vec_IntPush(p_00,iVar7);
    } while (((int)(uint)*(undefined8 *)pGVar11 < 0) &&
            (((uint)*(undefined8 *)pGVar11 & 0x1fffffff) != 0x1fffffff));
    iVar7 = p_00->nSize;
    if (iVar7 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
    }
    piVar9 = p_00->pArray;
    uVar8 = iVar7 - 1;
    p_00->nSize = uVar8;
    if (1 < uVar8) {
      iVar7 = iVar7 + -2;
      lVar10 = 0;
      do {
        iVar1 = piVar9[lVar10];
        piVar9[lVar10] = piVar9[iVar7];
        piVar9[iVar7] = iVar1;
        lVar10 = lVar10 + 1;
        iVar7 = iVar7 + -1;
      } while (lVar10 < (int)uVar8 / 2);
    }
    if ((~*(ulong *)pGVar11 & 0x1fffffff1fffffff) != 0) {
      __assert_fail("Gia_ObjIsConst0(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                    ,0x11a,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
    }
    iVar7 = p->nObjs;
    if ((1 < iVar7) &&
       (((undefined1  [12])p->pObjs[1] & (undefined1  [12])0x9fffffff) ==
        (undefined1  [12])0x9fffffff)) {
      pGVar11 = p->pObjs + 2;
      lVar10 = 1;
      do {
        if (p->nTravIdsAlloc <= lVar10) goto LAB_0022d9f2;
        p->pTravIds[lVar10] = p->nTravIds;
        lVar10 = lVar10 + 1;
        iVar7 = p->nObjs;
      } while ((lVar10 < iVar7) &&
              (GVar6 = *pGVar11, pGVar11 = pGVar11 + 1,
              ((undefined1  [12])GVar6 & (undefined1  [12])0x9fffffff) ==
              (undefined1  [12])0x9fffffff));
    }
    p_01 = Gia_ManStart(iVar7);
    pcVar3 = p->pName;
    if (pcVar3 == (char *)0x0) {
      pcVar13 = (char *)0x0;
    }
    else {
      sVar12 = strlen(pcVar3);
      pcVar13 = (char *)malloc(sVar12 + 1);
      strcpy(pcVar13,pcVar3);
    }
    p_01->pName = pcVar13;
    pcVar3 = p->pSpec;
    if (pcVar3 == (char *)0x0) {
      pcVar13 = (char *)0x0;
    }
    else {
      sVar12 = strlen(pcVar3);
      pcVar13 = (char *)malloc(sVar12 + 1);
      strcpy(pcVar13,pcVar3);
    }
    p_01->pSpec = pcVar13;
    p->pObjs->Value = 0;
    if (1 < p->nObjs) {
      lVar17 = 1;
      lVar10 = 5;
      do {
        if (p->nTravIdsAlloc <= lVar17) {
          __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (p->pTravIds[lVar17] == p->nTravIds) {
          pGVar11 = p->pObjs;
          uVar4 = *(ulong *)((long)pGVar11 + lVar10 * 4 + -8);
          uVar8 = (uint)uVar4;
          if ((uVar8 & 0x9fffffff) == 0x9fffffff) {
            pGVar14 = Gia_ManAppendObj(p_01);
            uVar4 = *(ulong *)pGVar14;
            *(ulong *)pGVar14 = uVar4 | 0x9fffffff;
            *(ulong *)pGVar14 =
                 uVar4 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar5 = p_01->pObjs;
            if ((pGVar14 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar14)) goto LAB_0022d995;
            Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar14 - (long)pGVar5) >> 2) * -0x55555555);
            pGVar5 = p_01->pObjs;
            if ((pGVar14 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar14)) goto LAB_0022d995;
            iVar7 = (int)((ulong)((long)pGVar14 - (long)pGVar5) >> 2) * 0x55555556;
          }
          else {
            iVar7 = (int)(uVar4 & 0x1fffffff);
            if ((uVar4 & 0x1fffffff) == 0x1fffffff || (int)uVar8 < 0) {
              if ((-1 < (int)uVar8) || (iVar7 == 0x1fffffff)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                              ,0x130,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
              }
              uVar2 = *(uint *)((long)pGVar11 + lVar10 * 4 + (ulong)(uint)(iVar7 << 2) * -3);
              if ((int)uVar2 < 0) goto LAB_0022d9d3;
              iVar7 = Gia_ManAppendCo(p_01,uVar2 ^ uVar8 >> 0x1d & 1);
            }
            else {
              uVar8 = *(uint *)((long)pGVar11 + lVar10 * 4 + (ulong)(uint)(iVar7 << 2) * -3);
              if (((int)uVar8 < 0) ||
                 (uVar2 = *(uint *)((long)pGVar11 +
                                   lVar10 * 4 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3),
                 (int)uVar2 < 0)) {
LAB_0022d9d3:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x132,"int Abc_LitNotCond(int, int)");
              }
              iVar7 = Gia_ManAppendAnd(p_01,uVar8 ^ (uint)(uVar4 >> 0x1d) & 1,
                                       uVar2 ^ (uint)(uVar4 >> 0x3d) & 1);
            }
          }
          *(int *)(&pGVar11->field_0x0 + lVar10 * 4) = iVar7;
        }
        lVar17 = lVar17 + 1;
        lVar10 = lVar10 + 3;
      } while (lVar17 < p->nObjs);
    }
    pvVar15 = Gia_ManUpdateTimMan(p,p_00);
    p_01->pManTime = pvVar15;
    if (p->pAigExtra == (Gia_Man_t *)0x0) {
      __assert_fail("p->pAigExtra != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                    ,0x135,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
    }
    if (p_01->pAigExtra == (Gia_Man_t *)0x0) {
      pGVar16 = Gia_ManUpdateExtraAig(p->pManTime,p->pAigExtra,p_00);
      p_01->pAigExtra = pGVar16;
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
      }
      free(p_00);
      return p_01;
    }
    __assert_fail("pNew->pAigExtra == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x136,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
  }
LAB_0022d995:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Gia_ManFraigCreateGia( Gia_Man_t * p )
{
    Vec_Int_t * vBoxPres;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, fLabelPos;
    assert( p->pManTime != NULL );
    // start marks
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    vBoxPres = Vec_IntAlloc( 1000 );
    // mark primary outputs
    fLabelPos = 1;
    pObj = Gia_ManObj( p, Gia_ManObjNum(p) - 1 );
    assert( Gia_ObjIsCo(pObj) );
    while ( Gia_ObjIsCo(pObj) )
    {
        pObj = Gia_ManFraigMarkCos( p, pObj, fLabelPos );
        if ( Gia_ObjIsAnd(pObj) )
            pObj = Gia_ManFraigMarkAnd( p, pObj );
        assert( Gia_ObjIsCi(pObj) );
        fLabelPos = Gia_ManFraigCheckCis(p, pObj);
        pObj = Gia_ManFraigMarkCis( p, pObj, fLabelPos );
        Vec_IntPush( vBoxPres, fLabelPos );
    }
    Vec_IntPop( vBoxPres );
    Vec_IntReverseOrder( vBoxPres );
    assert( Gia_ObjIsConst0(pObj) );
    // mark primary inputs
    Gia_ManForEachObj1( p, pObj, i )
        if ( Gia_ObjIsCi(pObj) )
            Gia_ObjSetTravIdCurrent( p, pObj );
        else
            break;
    // duplicate marked entries
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( !Gia_ObjIsTravIdCurrent(p, pObj) )
            continue;
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi(pNew);
        else if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else assert( 0 );
    }
    // update timing manager
    pNew->pManTime = Gia_ManUpdateTimMan( p, vBoxPres );
    // update extra STG
    assert( p->pAigExtra != NULL );
    assert( pNew->pAigExtra == NULL );
    pNew->pAigExtra = Gia_ManUpdateExtraAig( p->pManTime, p->pAigExtra, vBoxPres );
    Vec_IntFree( vBoxPres );
//    assert( Gia_ManPiNum(pNew) == Tim_ManCiNum(pNew->pManTime) );
//    assert( Gia_ManPoNum(pNew) == Tim_ManCoNum(pNew->pManTime) );
//    assert( Gia_ManPiNum(pNew) == Tim_ManPiNum(pNew->pManTime) + Gia_ManPoNum(pNew->pAigExtra) );
    return pNew;
}